

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O2

void __thiscall merkle_tests::merkle_test_oneTx_block::test_method(merkle_test_oneTx_block *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  uint256 *puVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  undefined1 local_189;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined **local_148;
  undefined1 local_140;
  undefined1 *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  CMutableTransaction mtx;
  bool mutated;
  uint256 root;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutated = false;
  CBlock::CBlock(&block);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&block.vtx,1);
  CMutableTransaction::CMutableTransaction(&mtx);
  mtx.nLockTime = 0;
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&root);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(block.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&root);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (root.super_base_blob<256U>.m_data._M_elems + 8));
  BlockMerkleRoot(&root,&block,&mutated);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x111;
  file.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_01139f30;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_150 = "";
  pvVar2 = (iterator)0x2;
  puVar3 = &root;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,transaction_identifier<false>>
            (&local_148,&local_158,0x111,1,2,puVar3,"root",
             &(((block.vtx.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->hash,
             "block.vtx[0]->GetHash()");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)puVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x112;
  file_00.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_01139f30;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_180 = "";
  local_189 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_148,&local_188,0x112,1,2,&mutated,"mutated",&local_189,"false");
  CMutableTransaction::~CMutableTransaction(&mtx);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_oneTx_block)
{
    bool mutated = false;
    CBlock block;

    block.vtx.resize(1);
    CMutableTransaction mtx;
    mtx.nLockTime = 0;
    block.vtx[0] = MakeTransactionRef(std::move(mtx));
    uint256 root = BlockMerkleRoot(block, &mutated);
    BOOST_CHECK_EQUAL(root, block.vtx[0]->GetHash());
    BOOST_CHECK_EQUAL(mutated, false);
}